

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionTreeVmEval.cpp
# Opt level: O1

VmConstant *
LoadFrameValue(InstructionVMEvalContext *ctx,VmConstant *pointer,VmConstant *offset,VmType type,
              uint loadSize)

{
  FunctionData *pFVar1;
  SynIdentifier *pSVar2;
  Storage *storage;
  VmConstant *pVVar3;
  uint offset_00;
  char *pcVar4;
  uint uVar5;
  int iVar6;
  VmValueType VVar7;
  bool bVar8;
  VmType type_00;
  VmType type_01;
  VmType type_02;
  uint base;
  uint local_44;
  TypeBase *local_40;
  InstructionVMEvalContext *local_38;
  
  type_00._0_8_ = type._0_8_;
  local_44 = 0;
  storage = FindTarget(ctx,pointer,&local_44);
  local_38 = ctx;
  if (storage == (Storage *)0x0) {
    pVVar3 = (VmConstant *)0x0;
  }
  else {
    local_40 = type.structType;
    if (ctx->printExecution == true) {
      pcVar4 = "---";
      iVar6 = 0x3701d5;
      if ((storage->functionOwner != (VmFunction *)0x0) &&
         (pFVar1 = storage->functionOwner->function, pFVar1 != (FunctionData *)0x0)) {
        pSVar2 = pFVar1->name;
        pcVar4 = (pSVar2->name).begin;
        iVar6 = (int)(pSVar2->name).end;
      }
      printf("      LoadFrameValue %.*s [%s] @ %04x + %02x [%02x]\n",
             (ulong)(uint)(iVar6 - (int)pcVar4),pcVar4,storage->tag,(ulong)local_44,
             (ulong)(ushort)pointer->iValue,loadSize);
    }
    offset_00 = (ushort)pointer->iValue + local_44;
    if (offset != (VmConstant *)0x0) {
      offset_00 = offset_00 + offset->iValue;
    }
    VVar7 = type.type;
    uVar5 = type.size;
    bVar8 = (uVar5 ^ 4) != 0 || (VVar7 ^ VM_TYPE_INT) != VM_TYPE_VOID;
    if (loadSize == 1 && ((uVar5 ^ 4) == 0 && (VVar7 ^ VM_TYPE_INT) == VM_TYPE_VOID)) {
      pVVar3 = LoadFrameByte(local_38,storage,offset_00);
    }
    else if (bVar8 || loadSize != 2) {
      if ((loadSize != 4) || (VVar7 != VM_TYPE_POINTER && bVar8)) {
        if (((uVar5 ^ 8) == 0 && (VVar7 ^ VM_TYPE_DOUBLE) == VM_TYPE_VOID) && loadSize == 4) {
          pVVar3 = LoadFrameFloat(local_38,storage,offset_00);
        }
        else if (((uVar5 ^ 8) == 0 && (VVar7 ^ VM_TYPE_DOUBLE) == VM_TYPE_VOID) && loadSize == 8) {
          pVVar3 = LoadFrameDouble(local_38,storage,offset_00);
        }
        else if ((loadSize == 8) &&
                (VVar7 == VM_TYPE_POINTER || uVar5 == 8 && VVar7 == VM_TYPE_LONG)) {
          type_01.structType = local_40;
          type_01.type = (int)type_00._0_8_;
          type_01.size = (int)((ulong)type_00._0_8_ >> 0x20);
          pVVar3 = LoadFrameLong(local_38,storage,offset_00,type_01);
        }
        else {
          type_02.structType = local_40;
          type_02.type = (int)type_00._0_8_;
          type_02.size = (int)((ulong)type_00._0_8_ >> 0x20);
          pVVar3 = LoadFrameStruct(local_38,storage,offset_00,type_02);
        }
      }
      else {
        type_00.structType = local_40;
        pVVar3 = LoadFrameInt(local_38,storage,offset_00,type_00);
      }
    }
    else {
      pVVar3 = LoadFrameShort(local_38,storage,offset_00);
    }
  }
  if (storage == (Storage *)0x0) {
    if (local_38->hasError == false) {
      __assert_fail("ctx.hasError",
                    "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeVmEval.cpp"
                    ,0x23f,
                    "VmConstant *LoadFrameValue(InstructionVMEvalContext &, VmConstant *, VmConstant *, VmType, unsigned int)"
                   );
    }
    pVVar3 = (VmConstant *)0x0;
  }
  return pVVar3;
}

Assistant:

VmConstant* LoadFrameValue(InstructionVMEvalContext &ctx, VmConstant *pointer, VmConstant *offset, VmType type, unsigned loadSize)
{
	unsigned base = 0;

	if(InstructionVMEvalContext::Storage *target = FindTarget(ctx, pointer, base))
	{
		if(ctx.printExecution)
		{
			InplaceStr functionName = target->functionOwner && target->functionOwner->function? target->functionOwner->function->name->name : InplaceStr("---");

			printf("      LoadFrameValue %.*s [%s] @ %04x + %02x [%02x]\n", FMT_ISTR(functionName), target->tag, base, pointer->iValue & memoryOffsetMask, loadSize);
		}

		unsigned location = (pointer->iValue & memoryOffsetMask) + base;

		if(offset)
			location += offset->iValue;

		if(type == VmType::Int && loadSize == 1)
			return LoadFrameByte(ctx, target, location);

		if(type == VmType::Int && loadSize == 2)
			return LoadFrameShort(ctx, target, location);

		if((type == VmType::Int || type.type == VM_TYPE_POINTER) && loadSize == 4)
			return LoadFrameInt(ctx, target, location, type);

		if(type == VmType::Double && loadSize == 4)
			return LoadFrameFloat(ctx, target, location);

		if(type == VmType::Double && loadSize == 8)
			return LoadFrameDouble(ctx, target, location);

		if((type == VmType::Long || type.type == VM_TYPE_POINTER) && loadSize == 8)
			return LoadFrameLong(ctx, target, location, type);

		return LoadFrameStruct(ctx, target, location, type);
	}

	assert(ctx.hasError);

	return NULL;
}